

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::ApplyS<Ptex::v2_2::PtexHalf,2>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  ushort *puVar1;
  ushort *puVar2;
  float fVar3;
  byte bVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ushort *puVar13;
  float fVar14;
  float fVar15;
  
  bVar4 = (k->res).ulog2;
  iVar12 = nTxChan << (bVar4 & 0x1f);
  lVar7 = (long)iVar12 * (long)k->vw;
  if ((int)lVar7 != 0) {
    puVar13 = (ushort *)((long)data + (long)(((k->v << (bVar4 & 0x1f)) + k->u) * nTxChan) * 2);
    puVar1 = puVar13 + lVar7;
    pfVar5 = k->ku;
    pfVar8 = k->kv;
    lVar11 = (long)nTxChan;
    lVar7 = k->uw * lVar11;
    iVar10 = (int)lVar7;
    do {
      fVar15 = *pfVar5;
      fVar14 = *(float *)(PtexHalf::h2fTable + (ulong)*puVar13 * 4) * fVar15;
      fVar15 = *(float *)(PtexHalf::h2fTable + (ulong)puVar13[1] * 4) * fVar15;
      lVar9 = lVar7 * 2 + lVar11 * -2;
      pfVar6 = pfVar5;
      if (iVar10 != nTxChan) {
        do {
          puVar2 = puVar13 + lVar11;
          fVar3 = pfVar6[1];
          fVar14 = fVar14 + fVar3 * *(float *)(PtexHalf::h2fTable + (ulong)puVar13[lVar11] * 4);
          fVar15 = fVar15 + fVar3 * *(float *)(PtexHalf::h2fTable + (ulong)puVar13[lVar11 + 1] * 4);
          lVar9 = lVar9 + lVar11 * -2;
          puVar13 = puVar2;
          pfVar6 = pfVar6 + 1;
        } while (lVar9 != 0);
      }
      fVar3 = *pfVar8;
      pfVar8 = pfVar8 + 1;
      *(ulong *)result =
           CONCAT44(fVar3 * fVar15 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar3 * fVar14 + (float)*(undefined8 *)result);
      puVar13 = puVar13 + lVar11 + (iVar12 - iVar10);
    } while (puVar13 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }